

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase149::run(TestCase149 *this)

{
  TestObject *pTVar1;
  TestObject *pTVar2;
  int iVar3;
  TestObject *firstElement;
  TestObject *pTVar4;
  int iVar5;
  TestObject *ptrCopy;
  size_t elementCount;
  Array<kj::(anonymous_namespace)::TestObject> array;
  Array<kj::(anonymous_namespace)::TestObject> result;
  TestObject *local_98;
  size_t sStack_90;
  TestObject *local_78;
  TestObject *pTStack_70;
  TestObject *local_68;
  undefined8 *local_60;
  undefined8 local_58;
  size_t local_50;
  undefined8 *local_48;
  TestObject *local_38;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  iVar5 = 0;
  pTVar4 = (TestObject *)
           _::HeapArrayDisposer::allocateImpl
                     (4,0,0x20,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_68 = pTVar4 + 0x20;
  local_60 = &_::HeapArrayDisposer::instance;
  local_58 = (TestObject *)((ulong)local_58._4_4_ << 0x20);
  local_78 = pTVar4;
  pTStack_70 = pTVar4;
  local_38 = pTVar4;
  do {
    if ((iVar5 != (anonymous_namespace)::TestObject::count) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[44],int&,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x9f,ERROR,
                 "\"failed: expected \" \"(i) == (TestObject::count)\", i, TestObject::count",
                 (char (*) [44])"failed: expected (i) == (TestObject::count)",(int *)&local_58,
                 &(anonymous_namespace)::TestObject::count);
    }
    TestObject::TestObject(pTVar4);
    firstElement = local_38;
    pTVar4 = pTVar4 + 1;
    iVar3 = (int)local_58;
    iVar5 = (int)local_58 + 1;
    local_58 = (TestObject *)CONCAT44(local_58._4_4_,iVar5);
  } while (iVar3 < 0x1f);
  pTStack_70 = pTVar4;
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    local_58 = (TestObject *)CONCAT44(local_58._4_4_,0x20);
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xa3,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",(int *)&local_58,
               &(anonymous_namespace)::TestObject::count);
  }
  elementCount = (long)pTStack_70 - (long)firstElement >> 2;
  local_48 = &_::HeapArrayDisposer::instance;
  local_58 = firstElement;
  local_68 = (TestObject *)0x0;
  pTStack_70 = (TestObject *)0x0;
  local_78 = (TestObject *)0x0;
  local_98 = firstElement;
  local_50 = elementCount;
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    local_58._4_4_ = (uint)((ulong)firstElement >> 0x20);
    local_58 = (TestObject *)CONCAT44(local_58._4_4_,0x20);
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xa5,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",(int *)&local_58,
               &(anonymous_namespace)::TestObject::count);
  }
  pTVar2 = local_68;
  pTVar1 = pTStack_70;
  pTVar4 = local_78;
  if (local_78 != (TestObject *)0x0) {
    local_78 = (TestObject *)0x0;
    pTStack_70 = (TestObject *)0x0;
    local_68 = (TestObject *)0x0;
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,pTVar4,4,
               (long)pTVar1 - (long)pTVar4 >> 2,(long)pTVar2 - (long)pTVar4 >> 2,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject,_false>::destruct);
  }
  if (((anonymous_namespace)::TestObject::count != 0x20) && (_::Debug::minSeverity < 3)) {
    local_78 = (TestObject *)CONCAT44(local_78._4_4_,0x20);
    _::Debug::log<char_const(&)[45],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xa8,ERROR,
               "\"failed: expected \" \"(32) == (TestObject::count)\", 32, TestObject::count",
               (char (*) [45])"failed: expected (32) == (TestObject::count)",(int *)&local_78,
               &(anonymous_namespace)::TestObject::count);
  }
  sStack_90 = elementCount;
  if (firstElement != (TestObject *)0x0) {
    local_98 = (TestObject *)0x0;
    sStack_90 = 0;
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,firstElement,4,elementCount,
               elementCount,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject,_false>::destruct);
  }
  if (((anonymous_namespace)::TestObject::count != 0) && (_::Debug::minSeverity < 3)) {
    local_78 = (TestObject *)((ulong)local_78 & 0xffffffff00000000);
    _::Debug::log<char_const(&)[44],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0xaa,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", 0, TestObject::count",
               (char (*) [44])"failed: expected (0) == (TestObject::count)",(int *)&local_78,
               &(anonymous_namespace)::TestObject::count);
  }
  if (local_98 != (TestObject *)0x0) {
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,local_98,4,sStack_90,sStack_90,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject,_false>::destruct);
  }
  return;
}

Assistant:

TEST(Array, AraryBuilder) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array;

  {
    ArrayBuilder<TestObject> builder = heapArrayBuilder<TestObject>(32);

    for (int i = 0; i < 32; i++) {
      EXPECT_EQ(i, TestObject::count);
      builder.add();
    }

    EXPECT_EQ(32, TestObject::count);
    array = builder.finish();
    EXPECT_EQ(32, TestObject::count);
  }

  EXPECT_EQ(32, TestObject::count);
  array = nullptr;
  EXPECT_EQ(0, TestObject::count);
}